

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<char_*,_false,_false>::grow_and_add
          (FastVector<char_*,_false,_false> *this,uint newSize,char **val)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  
  ppcVar2 = this->data;
  grow_no_destroy(this,newSize);
  pcVar3 = *val;
  uVar1 = this->count;
  this->count = uVar1 + 1;
  this->data[uVar1] = pcVar3;
  if (ppcVar2 != (char **)0x0) {
    (*(code *)NULLC::dealloc)(ppcVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}